

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::TJHexLow
          (AbstractContentContext *this,StringOrDoubleList *inStringsAndSpacing)

{
  bool bVar1;
  EStatusCode EVar2;
  pointer pSVar3;
  allocator<char> local_49;
  string local_48;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  StringOrDoubleList *inStringsAndSpacing_local;
  AbstractContentContext *this_local;
  
  it._M_node = (_List_node_base *)inStringsAndSpacing;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(inStringsAndSpacing);
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  AssertProcsetAvailable(this,&KProcsetText_abi_cxx11_);
  PrimitiveObjectsWriter::StartArray(&this->mPrimitiveWriter);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pSVar3 = std::
             _List_const_iterator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_20);
    if ((pSVar3->IsDouble & 1U) == 0) {
      pSVar3 = std::
               _List_const_iterator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_20);
      PrimitiveObjectsWriter::WriteHexString
                (&this->mPrimitiveWriter,&pSVar3->SomeValue,eTokenSeparatorSpace);
    }
    else {
      pSVar3 = std::
               _List_const_iterator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_20);
      PrimitiveObjectsWriter::WriteDouble
                (&this->mPrimitiveWriter,pSVar3->DoubleValue,eTokenSeparatorSpace);
    }
    std::
    _List_const_iterator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_20);
  }
  PrimitiveObjectsWriter::EndArray(&this->mPrimitiveWriter,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"TJ",&local_49);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  EVar2 = GetCurrentStatusCode(this);
  return EVar2;
}

Assistant:

EStatusCode AbstractContentContext::TJHexLow(const StringOrDoubleList& inStringsAndSpacing)
{
	StringOrDoubleList::const_iterator it = inStringsAndSpacing.begin();
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.StartArray();

	for(; it != inStringsAndSpacing.end();++it)
	{
		if(it->IsDouble)
			mPrimitiveWriter.WriteDouble(it->DoubleValue);
		else
			mPrimitiveWriter.WriteHexString(it->SomeValue);
	}
	
	mPrimitiveWriter.EndArray(eTokenSeparatorSpace);

	mPrimitiveWriter.WriteKeyword("TJ");
	return GetCurrentStatusCode();
}